

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testloadsave.cpp
# Opt level: O3

void load1(char *filename)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  Am_Value *pAVar4;
  char *pcVar5;
  long lVar6;
  Am_Value_List l3;
  Am_Value_List l2;
  Am_Value_List l4;
  Am_Value_List l1;
  ifstream in_file;
  Am_String aAStack_298 [8];
  Am_String local_290 [8];
  Am_Value local_288;
  Am_Value local_278;
  Am_Value local_268;
  Am_Value local_258;
  Am_Value_List local_248 [16];
  Am_Value_List local_238 [16];
  long local_228 [4];
  byte abStack_208 [488];
  
  std::ifstream::ifstream(local_228,filename,_S_in);
  if ((abStack_208[*(long *)(local_228[0] + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"open failed",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    goto LAB_00104338;
  }
  Am_Load_Save_Context::Reset();
  Am_Load_Save_Context::Load((istream *)&local_268);
  Am_Value_List::Am_Value_List(local_248,&local_268);
  Am_Value::~Am_Value(&local_268);
  Am_Load_Save_Context::Load((istream *)&local_288);
  Am_Value_List::Am_Value_List((Am_Value_List *)&local_268,&local_288);
  Am_Value::~Am_Value(&local_288);
  Am_Load_Save_Context::Load((istream *)&local_258);
  Am_Value_List::Am_Value_List((Am_Value_List *)&local_288,&local_258);
  Am_Value::~Am_Value(&local_258);
  Am_Load_Save_Context::Load((istream *)&local_278);
  Am_Value_List::Am_Value_List((Am_Value_List *)&local_258,&local_278);
  Am_Value::~Am_Value(&local_278);
  pAVar4 = (Am_Value *)Am_Value_List::Get_Nth((int)local_248);
  iVar3 = Am_Value::operator_cast_to_int(pAVar4);
  lVar6 = 0xd;
  pcVar5 = "Test 1 failed";
  if (iVar3 == 5) {
    pAVar4 = (Am_Value *)Am_Value_List::Get_Nth((int)local_248);
    Am_String::Am_String(aAStack_298,pAVar4);
    cVar1 = Am_String::operator==(aAStack_298,"hello");
    if (cVar1 != '\0') {
      pAVar4 = (Am_Value *)Am_Value_List::Get_Nth((int)local_248);
      iVar3 = Am_Value::operator_cast_to_int(pAVar4);
      if (iVar3 == 10) {
        cVar1 = Am_Value_List::operator==(local_248,(Am_Value_List *)&local_268);
        if (cVar1 != '\0') {
          pAVar4 = (Am_Value *)Am_Value_List::Get_Nth((int)&local_288);
          iVar3 = Am_Value::operator_cast_to_int(pAVar4);
          if (iVar3 == 5) {
            pAVar4 = (Am_Value *)Am_Value_List::Get_Nth((int)&local_288);
            Am_String::Am_String(local_290,pAVar4);
            cVar1 = Am_String::operator==(local_290,"hello");
            if (cVar1 != '\0') {
              pAVar4 = (Am_Value *)Am_Value_List::Get_Nth((int)&local_288);
              iVar3 = Am_Value::operator_cast_to_int(pAVar4);
              if (iVar3 == 10) {
                pAVar4 = (Am_Value *)Am_Value_List::Get_Nth((int)&local_288);
                Am_Value_List::Am_Value_List((Am_Value_List *)&local_278,pAVar4);
                cVar1 = Am_Value_List::operator==((Am_Value_List *)&local_278,local_248);
                if (cVar1 != '\0') {
                  pAVar4 = (Am_Value *)Am_Value_List::Get_Nth((int)&local_288);
                  Am_Value_List::Am_Value_List(local_238,pAVar4);
                  cVar1 = Am_Value_List::operator==(local_238,(Am_Value_List *)&local_268);
                  if (cVar1 != '\0') {
                    bVar2 = Am_Value_List::operator==
                                      ((Am_Value_List *)&local_258,
                                       (Am_Value_List *)&Am_No_Value_List);
                    Am_Value_List::~Am_Value_List(local_238);
                    Am_Value_List::~Am_Value_List((Am_Value_List *)&local_278);
                    Am_String::~Am_String(local_290);
                    Am_String::~Am_String(aAStack_298);
                    pcVar5 = "Test 1 failed";
                    if (bVar2 != 0) {
                      pcVar5 = "Test 1 okay";
                    }
                    lVar6 = (ulong)(bVar2 ^ 1) * 2 + 0xb;
                    goto LAB_001042d0;
                  }
                  Am_Value_List::~Am_Value_List(local_238);
                }
                Am_Value_List::~Am_Value_List((Am_Value_List *)&local_278);
              }
            }
            Am_String::~Am_String(local_290);
          }
        }
      }
    }
    Am_String::~Am_String(aAStack_298);
  }
LAB_001042d0:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,lVar6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  Am_Value_List::~Am_Value_List((Am_Value_List *)&local_258);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&local_288);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&local_268);
  Am_Value_List::~Am_Value_List(local_248);
LAB_00104338:
  std::ifstream::~ifstream(local_228);
  return;
}

Assistant:

void
load1(const char *filename)
{
  // open input-file
  std::ifstream in_file(filename, std::ios::in);
  if (!in_file) {
    std::cout << "open failed" << std::endl;
    return;
  }

  // reset internal reference counters etc. (should always be done for new stream)
  Am_Default_Load_Save_Context.Reset();

  // read-in the different Am_Value_List objects
  Am_Value_List l1 = Am_Default_Load_Save_Context.Load(in_file);
  Am_Value_List l2 = Am_Default_Load_Save_Context.Load(in_file);
  Am_Value_List l3 = Am_Default_Load_Save_Context.Load(in_file);
  Am_Value_List l4 = Am_Default_Load_Save_Context.Load(in_file);

  if ((int)l1.Get_Nth(0) == 5 && Am_String(l1.Get_Nth(1)) == "hello" &&
      (int)l1.Get_Nth(2) == 10 && l1 == l2 && (int)l3.Get_Nth(0) == 5 &&
      Am_String(l3.Get_Nth(1)) == "hello" && (int)l3.Get_Nth(2) == 10 &&
      Am_Value_List(l3.Get_Nth(3)) == l1 &&
      Am_Value_List(l3.Get_Nth(4)) == l2 && l4 == Am_No_Value_List) {
    std::cout << "Test 1 okay" << std::endl;
  } else {
    std::cout << "Test 1 failed" << std::endl;
  }

  return;
}